

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O0

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,PowConstraint *con,double param_3,double param_4,Context ctx)

{
  CtxVal *pCVar1;
  reference pvVar2;
  long in_RSI;
  array<int,_1UL> *in_RDI;
  double dVar3;
  double lb;
  VarArray1 yy;
  VarArray1 xx;
  Context ctx_y;
  Context ctx_x;
  value_type y;
  value_type x;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff90;
  Context *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  value_type vVar4;
  Context ctx_00;
  Context local_48;
  Context local_44;
  Context local_40;
  Context local_3c;
  Context local_38;
  value_type local_34;
  CtxVal local_30;
  long local_18;
  
  local_18 = in_RSI;
  FunctionalConstraint::AddContext
            ((FunctionalConstraint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (Context)(CtxVal)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>::GetArguments
            ((CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId> *)
             (local_18 + 0x28));
  pCVar1 = (CtxVal *)
           std::array<int,_2UL>::operator[]
                     ((array<int,_2UL> *)in_stack_ffffffffffffff90,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_30 = *pCVar1;
  CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>::GetArguments
            ((CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId> *)
             (local_18 + 0x28));
  pvVar2 = std::array<int,_2UL>::operator[]
                     ((array<int,_2UL> *)in_stack_ffffffffffffff90,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_34 = *pvVar2;
  Context::Context(&local_38,CTX_NONE);
  Context::Context(&local_3c,CTX_NONE);
  dVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::lb(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (dVar3 < 0.0) {
    Context::Context(&local_48,CTX_MIX);
    local_3c.value_ = local_48.value_;
    local_38.value_ = local_48.value_;
  }
  else {
    dVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::lb(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (dVar3 < 0.0) {
      dVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::ub(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (0.0 < dVar3) {
        Context::Context(&local_40,CTX_MIX);
      }
      else {
        local_40 = Context::operator-(in_stack_ffffffffffffff98);
      }
    }
    else {
      local_40 = Context::operator+(in_stack_ffffffffffffff98);
    }
    local_38.value_ = local_40.value_;
    dVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::ub(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (1.0 < dVar3) {
      dVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::lb(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (dVar3 < 1.0) {
        Context::Context(&local_44,CTX_MIX);
      }
      else {
        local_44 = Context::operator+(in_stack_ffffffffffffff98);
      }
    }
    else {
      local_44 = Context::operator-(in_stack_ffffffffffffff98);
    }
    local_3c.value_ = local_44.value_;
  }
  ctx_00.value_ = local_30;
  dVar3 = BasicFlatConverter::MinusInfty();
  BasicFlatConverter::Infty();
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::PropagateResult2Args<std::array<int,1ul>>
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI,
             (double)in_stack_ffffffffffffff98,dVar3,ctx_00);
  vVar4 = local_34;
  lb = BasicFlatConverter::MinusInfty();
  BasicFlatConverter::Infty();
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::PropagateResult2Args<std::array<int,1ul>>
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)CONCAT44(vVar4,local_3c.value_),in_RDI,lb,dVar3,ctx_00);
  return;
}

Assistant:

void PropagateResult(
      PowConstraint& con, double , double , Context ctx) {
    con.AddContext(ctx);           // merge context
    auto x = con.GetArguments()[0];
    auto y = con.GetArguments()[1];
    Context ctx_x, ctx_y;
    if (MPCD( lb(x) )>=0.0 ) {     // x >= 0
      ctx_x = (MPCD( lb(y) ) >= 0.0)
                  ? +ctx
                  : MPCD( ub(y) ) <= 0.0
                        ? -ctx: Context::CTX_MIX;
      ctx_y = (MPCD( ub(x) ) <= 1.0)  // 0<=x<=1
                  ? -ctx
                  : MPCD( lb(x) ) >= 1.0  // x>=1
                        ? +ctx
                        : Context::CTX_MIX;
    } else {
      ctx_x = ctx_y = Context::CTX_MIX;
    }
    VarArray1 xx {x};
    PropagateResult2Args(xx,
                         MPD( MinusInfty() ), MPD( Infty() ),
                         ctx_x);
    VarArray1 yy {y};
    PropagateResult2Args(yy,
                         MPD( MinusInfty() ), MPD( Infty() ),
                         ctx_y);
  }